

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> * __thiscall
cfd::core::Transaction::GetTxInList
          (vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
           *__return_storage_ptr__,Transaction *this)

{
  bool bVar1;
  reference pTVar2;
  TxInReference local_168;
  undefined1 local_c8 [8];
  TxIn tx_in;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range2;
  Transaction *this_local;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *refs;
  
  ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::vector
            (__return_storage_ptr__);
  __end2 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin(&this->vin_);
  tx_in.super_AbstractTxIn.script_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end(&this->vin_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                                     *)((long)&tx_in.super_AbstractTxIn.script_witness_.
                                               witness_stack_.
                                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                               ._M_impl.super__Vector_impl_data + 0x10)), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
             ::operator*(&__end2);
    TxIn::TxIn((TxIn *)local_c8,pTVar2);
    TxInReference::TxInReference(&local_168,(TxIn *)local_c8);
    ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::push_back
              (__return_storage_ptr__,&local_168);
    TxInReference::~TxInReference((TxInReference *)0x436867);
    TxIn::~TxIn((TxIn *)0x436873);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<TxInReference> Transaction::GetTxInList() const {
  std::vector<TxInReference> refs;
  for (TxIn tx_in : vin_) {
    refs.push_back(TxInReference(tx_in));
  }
  return refs;
}